

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories
               (cmGeneratedFileStream *fout,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *includeDirs,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emittedDirs)

{
  bool bVar1;
  iterator iVar2;
  ostream *poVar3;
  pointer pbVar4;
  pointer in_relative;
  string dir;
  RegularExpression frameworkRx;
  string local_180;
  cmGeneratedFileStream *local_160;
  string local_158;
  string local_138;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_118;
  _Base_ptr local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_108;
  RegularExpression local_100;
  
  in_relative = (includeDirs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (includeDirs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (in_relative != pbVar4) {
    local_110 = &(emittedDirs->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_160 = fout;
    local_118 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)emittedDirs;
    local_108 = includeDirs;
    do {
      if (in_relative->_M_string_length != 0) {
        cmsys::SystemTools::CollapseFullPath(&local_138,in_relative);
        local_100.program = (char *)0x0;
        cmsys::RegularExpression::compile(&local_100,"(.+/Frameworks)/.+\\.framework/");
        bVar1 = cmsys::RegularExpression::find(&local_100,local_138._M_dataplus._M_p);
        if (bVar1) {
          if (local_100.startp[1] == (char *)0x0) {
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            local_180._M_string_length = 0;
            local_180.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,local_100.startp[1],local_100.endp[1]);
          }
          std::__cxx11::string::operator=((string *)&local_138,(string *)&local_180);
          emittedDirs = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_118;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,
                            CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                     local_180.field_2._M_local_buf[0]) + 1);
            emittedDirs = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_118;
          }
        }
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&emittedDirs->_M_t,&local_138);
        if (iVar2._M_node == local_110) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)emittedDirs,&local_138);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_160,"<pathentry include=\"",0x14);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,local_138._M_dataplus._M_p,
                     local_138._M_dataplus._M_p + local_138._M_string_length);
          EscapeForXML(&local_180,&local_158);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_160,local_180._M_dataplus._M_p,
                              local_180._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"\" kind=\"inc\" path=\"\" system=\"true\"/>\n",0x25);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,
                            CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                     local_180.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_100.program != (char *)0x0) {
          operator_delete__(local_100.program);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        pbVar4 = (local_108->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      in_relative = in_relative + 1;
    } while (in_relative != pbVar4);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories(
                            cmGeneratedFileStream& fout,
                            const std::vector<std::string>& includeDirs,
                            std::set<std::string>& emittedDirs)
{
  for(std::vector<std::string>::const_iterator inc = includeDirs.begin();
      inc != includeDirs.end();
      ++inc)
    {
    if (!inc->empty())
      {
      std::string dir = cmSystemTools::CollapseFullPath(*inc);

      // handle framework include dirs on OSX, the remainder after the
      // Frameworks/ part has to be stripped
      //   /System/Library/Frameworks/GLUT.framework/Headers
      cmsys::RegularExpression frameworkRx("(.+/Frameworks)/.+\\.framework/");
      if(frameworkRx.find(dir.c_str()))
        {
        dir = frameworkRx.match(1);
        }

      if(emittedDirs.find(dir) == emittedDirs.end())
        {
        emittedDirs.insert(dir);
        fout << "<pathentry include=\""
             << cmExtraEclipseCDT4Generator::EscapeForXML(
                              cmExtraEclipseCDT4Generator::GetEclipsePath(dir))
             << "\" kind=\"inc\" path=\"\" system=\"true\"/>\n";
        }
      }
    }
}